

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
::
find_or_prepare_insert_non_soo<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
          *this,pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> *key)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ushort uVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  bool bVar22;
  char cVar23;
  ushort uVar24;
  MixingHashState MVar25;
  ctrl_t *pcVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  __m128i match;
  undefined1 auVar36 [16];
  FindInfo FVar37;
  ulong local_78;
  char cVar30;
  char cVar33;
  char cVar34;
  char cVar35;
  
  MVar25 = hash_internal::HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>::
           combine<void_const*,std::basic_string_view<char,std::char_traits<char>>>
                     ((MixingHashState)&hash_internal::MixingHashState::kSeed,&key->first,
                      &key->second);
  uVar2 = *(ulong *)this;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x145,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar3 = *(ulong *)(this + 0x10);
  uVar29 = MVar25.state_ >> 7 ^ uVar3 >> 0xc;
  auVar31 = ZEXT216(CONCAT11((char)MVar25.state_,(char)MVar25.state_) & 0x7f7f);
  auVar31 = pshuflw(auVar31,auVar31,0);
  local_78 = 0;
  do {
    uVar29 = uVar29 & uVar2;
    pcVar1 = (char *)(uVar3 + uVar29);
    cVar23 = *pcVar1;
    cVar7 = pcVar1[1];
    cVar8 = pcVar1[2];
    cVar9 = pcVar1[3];
    cVar10 = pcVar1[4];
    cVar11 = pcVar1[5];
    cVar12 = pcVar1[6];
    cVar13 = pcVar1[7];
    cVar14 = pcVar1[8];
    cVar15 = pcVar1[9];
    cVar16 = pcVar1[10];
    cVar17 = pcVar1[0xb];
    cVar18 = pcVar1[0xc];
    cVar19 = pcVar1[0xd];
    cVar20 = pcVar1[0xe];
    cVar21 = pcVar1[0xf];
    cVar30 = auVar31[0];
    auVar32[0] = -(cVar30 == cVar23);
    cVar33 = auVar31[1];
    auVar32[1] = -(cVar33 == cVar7);
    cVar34 = auVar31[2];
    auVar32[2] = -(cVar34 == cVar8);
    cVar35 = auVar31[3];
    auVar32[3] = -(cVar35 == cVar9);
    auVar32[4] = -(cVar30 == cVar10);
    auVar32[5] = -(cVar33 == cVar11);
    auVar32[6] = -(cVar34 == cVar12);
    auVar32[7] = -(cVar35 == cVar13);
    auVar32[8] = -(cVar30 == cVar14);
    auVar32[9] = -(cVar33 == cVar15);
    auVar32[10] = -(cVar34 == cVar16);
    auVar32[0xb] = -(cVar35 == cVar17);
    auVar32[0xc] = -(cVar30 == cVar18);
    auVar32[0xd] = -(cVar33 == cVar19);
    auVar32[0xe] = -(cVar34 == cVar20);
    auVar32[0xf] = -(cVar35 == cVar21);
    uVar24 = (ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe | (ushort)(auVar32[0xf] >> 7) << 0xf;
    uVar27 = (uint)uVar24;
    while (uVar24 != 0) {
      uVar5 = 0;
      if (uVar27 != 0) {
        for (; (uVar27 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar28 = uVar5 + uVar29 & uVar2;
      bVar22 = std::
               equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator()((equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)this,(pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)(uVar28 * 0x20 + *(long *)(this + 0x18)),key);
      if (bVar22) {
        if (*(long *)(this + 0x10) == 0) goto LAB_00218f7b;
        pcVar26 = (ctrl_t *)(*(long *)(this + 0x10) + uVar28);
        bVar22 = false;
        goto LAB_00218f3b;
      }
      uVar24 = (ushort)(uVar27 - 1) & (ushort)uVar27;
      uVar27 = CONCAT22((short)(uVar27 - 1 >> 0x10),uVar24);
    }
    auVar36[0] = -(cVar23 == -0x80);
    auVar36[1] = -(cVar7 == -0x80);
    auVar36[2] = -(cVar8 == -0x80);
    auVar36[3] = -(cVar9 == -0x80);
    auVar36[4] = -(cVar10 == -0x80);
    auVar36[5] = -(cVar11 == -0x80);
    auVar36[6] = -(cVar12 == -0x80);
    auVar36[7] = -(cVar13 == -0x80);
    auVar36[8] = -(cVar14 == -0x80);
    auVar36[9] = -(cVar15 == -0x80);
    auVar36[10] = -(cVar16 == -0x80);
    auVar36[0xb] = -(cVar17 == -0x80);
    auVar36[0xc] = -(cVar18 == -0x80);
    auVar36[0xd] = -(cVar19 == -0x80);
    auVar36[0xe] = -(cVar20 == -0x80);
    auVar36[0xf] = -(cVar21 == -0x80);
    uVar24 = (ushort)(SUB161(auVar36 >> 7,0) & 1) | (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe | (ushort)(auVar36[0xf] >> 7) << 0xf;
    if (uVar24 != 0) {
      cVar23 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                         (*(ulong *)this,MVar25.state_,*(ctrl_t **)(this + 0x10));
      if (cVar23 == '\0') {
        uVar27 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
          }
        }
      }
      else {
        uVar6 = 0xf;
        if (uVar24 != 0) {
          for (; uVar24 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar27 = (ushort)((uVar6 ^ 0xfff0) + 0x11) - 1;
      }
      FVar37.offset = uVar27 + uVar29 & uVar2;
      FVar37.probe_length = local_78;
      uVar28 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                         ((CommonFields *)this,MVar25.state_,FVar37,
                          (PolicyFunctions *)GetPolicyFunctions()::value);
      if (*(long *)(this + 0x10) == 0) {
LAB_00218f7b:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9c4,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>, absl::hash_internal::Hash<std::pair<const void *, std::basic_string_view<char>>>, std::equal_to<std::pair<const void *, std::basic_string_view<char>>>, std::allocator<std::pair<const std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>, Hash = absl::hash_internal::Hash<std::pair<const void *, std::basic_string_view<char>>>, Eq = std::equal_to<std::pair<const void *, std::basic_string_view<char>>>, Alloc = std::allocator<std::pair<const std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>>]"
                     );
      }
      pcVar26 = (ctrl_t *)(*(long *)(this + 0x10) + uVar28);
      bVar22 = true;
LAB_00218f3b:
      lVar4 = *(long *)(this + 0x18);
      (__return_storage_ptr__->first).ctrl_ = pcVar26;
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(uVar28 * 0x20 + lVar4);
      __return_storage_ptr__->second = bVar22;
      return __return_storage_ptr__;
    }
    uVar29 = uVar29 + local_78 + 0x10;
    local_78 = local_78 + 0x10;
    if (*(ulong *)this < local_78) {
      __assert_fail("seq.index() <= capacity() && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xef5,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>, absl::hash_internal::Hash<std::pair<const void *, std::basic_string_view<char>>>, std::equal_to<std::pair<const void *, std::basic_string_view<char>>>, std::allocator<std::pair<const std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>, Hash = absl::hash_internal::Hash<std::pair<const void *, std::basic_string_view<char>>>, Eq = std::equal_to<std::pair<const void *, std::basic_string_view<char>>>, Alloc = std::allocator<std::pair<const std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>>, K = std::pair<const void *, std::basic_string_view<char>>]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    assert(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }